

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

MontyContext * monty_new(mp_int *modulus)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  MontyContext *pMVar4;
  mp_int *pmVar5;
  mp_int *pmVar6;
  ulong uVar7;
  long lVar8;
  
  pMVar4 = (MontyContext *)safemalloc(1,0x48,0);
  sVar1 = modulus->nw;
  pMVar4->rw = sVar1;
  pMVar4->rbits = sVar1 << 6;
  pMVar4->pw = sVar1 * 2 + 1;
  pmVar5 = mp_copy(modulus);
  pMVar4->m = pmVar5;
  pmVar5 = mp_invert_mod_2to(pmVar5,pMVar4->rbits);
  pMVar4->minus_minv_mod_r = pmVar5;
  mp_neg_into(pmVar5,pmVar5);
  pmVar5 = mp_make_sized(pMVar4->rw + 1);
  pmVar5->w[pMVar4->rw] = 1;
  pmVar6 = mp_mod(pmVar5,pMVar4->m);
  pMVar4->powers_of_r_mod_m[0] = pmVar6;
  mp_free(pmVar5);
  for (lVar8 = 6; lVar8 != 8; lVar8 = lVar8 + 1) {
    pmVar5 = mp_modmul(pMVar4->powers_of_r_mod_m[0],pMVar4->powers_of_r_mod_m[lVar8 + -6],pMVar4->m)
    ;
    pMVar4->powers_of_r_mod_m[lVar8 + -5] = pmVar5;
  }
  uVar2 = pMVar4->rw;
  uVar3 = pMVar4->pw;
  uVar7 = uVar2;
  if (uVar3 < uVar2) {
    uVar7 = uVar3;
  }
  pmVar5 = mp_make_sized(uVar7 * 6 + uVar2 * 3 + uVar3);
  pMVar4->scratch = pmVar5;
  return pMVar4;
}

Assistant:

MontyContext *monty_new(mp_int *modulus)
{
    MontyContext *mc = snew(MontyContext);

    mc->rw = modulus->nw;
    mc->rbits = mc->rw * BIGNUM_INT_BITS;
    mc->pw = mc->rw * 2 + 1;

    mc->m = mp_copy(modulus);

    mc->minus_minv_mod_r = mp_invert_mod_2to(mc->m, mc->rbits);
    mp_neg_into(mc->minus_minv_mod_r, mc->minus_minv_mod_r);

    mp_int *r = mp_make_sized(mc->rw + 1);
    r->w[mc->rw] = 1;
    mc->powers_of_r_mod_m[0] = mp_mod(r, mc->m);
    mp_free(r);

    for (size_t j = 1; j < lenof(mc->powers_of_r_mod_m); j++)
        mc->powers_of_r_mod_m[j] = mp_modmul(
            mc->powers_of_r_mod_m[0], mc->powers_of_r_mod_m[j-1], mc->m);

    mc->scratch = mp_make_sized(monty_scratch_size(mc));

    return mc;
}